

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::SelectRows::dim_forward
          (Dim *__return_storage_ptr__,SelectRows *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  long lVar3;
  ostream *poVar4;
  invalid_argument *this_00;
  uint uVar5;
  uint uVar6;
  undefined8 local_18;
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar2 == 0x24) &&
     (uVar1 = pDVar2->nd, uVar1 < 3)) {
    uVar5 = (uint)((ulong)((long)(this->prows->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->prows->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    if (uVar1 == 1) {
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->bd = 1;
      __return_storage_ptr__->d[0] = uVar5;
    }
    else {
      uVar6 = 1;
      if (uVar1 == 2) {
        uVar6 = pDVar2->d[1];
      }
      local_18 = CONCAT44(uVar6,uVar5);
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = 1;
      lVar3 = 0;
      do {
        uVar1 = *(uint *)((long)&local_18 + lVar3);
        uVar5 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar5 + 1;
        __return_storage_ptr__->d[uVar5] = uVar1;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
    }
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments in SelectRows: ",0x1d);
  poVar4 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar4);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to SelectRows");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectRows::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() > 2) {
    cerr << "Bad arguments in SelectRows: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectRows");
  }
  unsigned nrows = prows->size();
  if (xs[0].ndims() == 1) return Dim({nrows});
  return Dim({nrows, xs[0].cols()});
}